

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

char * sx_replace(char *dest,int dest_sz,char *src,char *find,char *replace)

{
  char cVar1;
  code *pcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  
  if (dest != src) {
    cVar1 = *find;
    iVar3 = sx_strlen(find);
    iVar4 = sx_strlen(replace);
    iVar5 = sx_strlen(src);
    cVar8 = *src;
    uVar11 = 0;
    if (1 < dest_sz && cVar8 != '\0') {
      pcVar7 = src;
      do {
        iVar9 = (int)uVar11;
        if (((cVar1 == cVar8) && (iVar5 = iVar5 + ((int)src - (int)pcVar7), iVar3 <= iVar5)) &&
           (iVar6 = bcmp(pcVar7,find,(long)iVar3), iVar6 == 0)) {
          pcVar7 = pcVar7 + iVar3;
          iVar6 = (dest_sz + -1) - iVar9;
          if (iVar4 <= iVar6) {
            iVar6 = iVar4;
          }
          memcpy(dest + iVar9,replace,(long)iVar6);
          uVar10 = iVar6 + iVar9;
        }
        else {
          uVar10 = iVar9 + 1;
          dest[iVar9] = cVar8;
        }
        uVar11 = (ulong)uVar10;
        cVar8 = pcVar7[1];
      } while ((cVar8 != '\0') && (pcVar7 = pcVar7 + 1, (int)uVar10 < dest_sz + -1));
      uVar11 = (ulong)(int)uVar10;
    }
    dest[uVar11] = '\0';
    return dest;
  }
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                    0x23c,"dest != src");
  pcVar2 = (code *)swi(3);
  pcVar7 = (char *)(*pcVar2)();
  return pcVar7;
}

Assistant:

char* sx_replace(char* dest, int dest_sz, const char* src, const char* find, const char* replace)
{
    sx_assert(dest != src);

    char f = find[0];
    int flen = sx_strlen(find);
    int rlen = sx_strlen(replace);
    int srclen = sx_strlen(src);
    int offset = 0;
    int dest_max = dest_sz - 1;
    const char* start = src;

    while (*src && offset < dest_max) {
        // Found first character, check for rest
        if (f != *src) {
            dest[offset++] = *src;
        } else {
            srclen -= (int)(intptr_t)(src - start);

            if (srclen >= flen && sx_memcmp(src, find, flen) == 0) {
                src += flen;
                int l = sx_min(dest_max - offset, rlen);
                sx_memcpy(dest + offset, replace, l);
                offset += l;
            } else {
                dest[offset++] = *src;
            }
        }

        ++src;
    }

    dest[offset] = '\0';
    return dest;
}